

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateRequiresForSCC
          (Generator *this,GeneratorOptions *options,Printer *printer,SCC *scc,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *provided)

{
  pointer ppDVar1;
  GeneratorOptions *options_00;
  uint uVar2;
  GeneratorOptions *desc;
  GeneratorOptions *options_01;
  pointer ppDVar3;
  Generator *this_00;
  bool bVar4;
  bool have_message;
  Printer *local_b0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  Generator *local_a0;
  GeneratorOptions *local_98;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  forwards;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  required;
  
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &required._M_t._M_impl.super__Rb_tree_header._M_header;
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  required._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &forwards._M_t._M_impl.super__Rb_tree_header._M_header;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  forwards._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  have_message = false;
  ppDVar1 = (scc->descriptors).
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  options_01 = (GeneratorOptions *)0x0;
  this_00 = (Generator *)0x0;
  local_b0 = printer;
  local_a8 = provided;
  local_a0 = this;
  local_98 = options;
  forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       forwards._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  required._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       required._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (ppDVar3 = (scc->descriptors).
                 super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppDVar3 != ppDVar1;
      ppDVar3 = ppDVar3 + 1) {
    options_00 = (GeneratorOptions *)*ppDVar3;
    if (*(long *)((long)&(options_00->output_dir).field_2 + 8) == 0) {
      desc = local_98;
      FindRequiresForMessage
                (local_a0,local_98,(Descriptor *)options_00,&required,&forwards,&have_message);
      uVar2 = 1;
      bVar4 = this_00 == (Generator *)0x0;
      this_00 = (Generator *)0x1;
      if (bVar4) {
        bVar4 = anon_unknown_0::HasExtensions((Descriptor *)options_00);
        this_00 = (Generator *)(ulong)bVar4;
      }
      if (options_01 == (GeneratorOptions *)0x0) {
        bVar4 = anon_unknown_0::HasMap(options_00,(Descriptor *)desc);
        uVar2 = (uint)bVar4;
      }
      options_01 = (GeneratorOptions *)(ulong)uVar2;
    }
  }
  GenerateRequiresImpl
            (this_00,options_01,local_b0,&required,&forwards,local_a8,have_message,SUB81(this_00,0),
             SUB81(options_01,0));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&forwards._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&required._M_t);
  return;
}

Assistant:

void Generator::GenerateRequiresForSCC(const GeneratorOptions& options,
                                       io::Printer* printer, const SCC* scc,
                                       std::set<std::string>* provided) const {
  std::set<std::string> required;
  std::set<std::string> forwards;
  bool have_message = false;
  bool has_extension = false;
  bool has_map = false;
  for (auto desc : scc->descriptors) {
    if (desc->containing_type() == nullptr) {
      FindRequiresForMessage(options, desc, &required, &forwards,
                             &have_message);
      has_extension = (has_extension || HasExtensions(desc));
      has_map = (has_map || HasMap(options, desc));
    }
  }

  GenerateRequiresImpl(options, printer, &required, &forwards, provided,
                       /* require_jspb = */ have_message,
                       /* require_extension = */ has_extension,
                       /* require_map = */ has_map);
}